

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O0

base_learner * multilabel_oaa_setup(options_i *options,vw *all)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  typed_option<unsigned_long> *this;
  base_learner *dat;
  single_learner *base;
  learner<multi_oaa,_example> *this_00;
  long in_RSI;
  long *in_RDI;
  learner<multi_oaa,_example> *l;
  option_group_definition new_options;
  free_ptr<multi_oaa> data;
  undefined4 in_stack_fffffffffffffd38;
  prediction_type_t in_stack_fffffffffffffd3c;
  vw *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  _func_void_multi_oaa_ptr_learner<char,_example>_ptr_example_ptr *predict;
  learner<multi_oaa,_example> *in_stack_fffffffffffffd50;
  typed_option<unsigned_long> *op;
  allocator local_249;
  string local_248 [39];
  undefined1 local_221 [40];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_long> local_1d8;
  learner<char,_char> *in_stack_ffffffffffffff00;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  undefined1 local_28 [16];
  long local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<multi_oaa>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Multilabel One Against All",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd40,
             (string *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"multilabel_oaa",&local_1f9);
  std::unique_ptr<multi_oaa,_void_(*)(void_*)>::operator->
            ((unique_ptr<multi_oaa,_void_(*)(void_*)> *)0x36990c);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffd48,(unsigned_long *)in_stack_fffffffffffffd40);
  this = VW::config::typed_option<unsigned_long>::keep(&local_1d8,true);
  op = (typed_option<unsigned_long> *)local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_221 + 1),"One-against-all multilabel with <k> labels",(allocator *)op)
  ;
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffd40,
             (string *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffd40,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  VW::config::option_group_definition::add<unsigned_long>((option_group_definition *)this,op);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffd40);
  std::__cxx11::string::~string((string *)(local_221 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_221);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffd40);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (**(code **)*local_10)(local_10,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"multilabel_oaa",&local_249);
  bVar9 = (**(code **)(*local_10 + 8))(local_10,local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  if (((bVar9 ^ 0xff) & 1) == 0) {
    dat = setup_base((options_i *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    base = LEARNER::as_singleline<char,char>(in_stack_ffffffffffffff00);
    predict = (_func_void_multi_oaa_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
    std::unique_ptr<multi_oaa,_void_(*)(void_*)>::operator->
              ((unique_ptr<multi_oaa,_void_(*)(void_*)> *)0x369c74);
    this_00 = LEARNER::init_learner<multi_oaa,example,LEARNER::learner<char,example>>
                        ((free_ptr<multi_oaa> *)dat,base,
                         (_func_void_multi_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffd50,predict,(size_t)in_stack_fffffffffffffd40,
                         in_stack_fffffffffffffd3c);
    in_stack_fffffffffffffd50 = this_00;
    LEARNER::learner<multi_oaa,_example>::set_finish_example(this_00,finish_example);
    lVar1 = *(long *)(local_18 + 8);
    *(undefined8 *)(lVar1 + 0x370) = MULTILABEL::multilabel._64_8_;
    uVar8 = MULTILABEL::multilabel._56_8_;
    uVar7 = MULTILABEL::multilabel._40_8_;
    uVar6 = MULTILABEL::multilabel._32_8_;
    uVar5 = MULTILABEL::multilabel._24_8_;
    uVar4 = MULTILABEL::multilabel._16_8_;
    uVar3 = MULTILABEL::multilabel._8_8_;
    uVar2 = MULTILABEL::multilabel._0_8_;
    *(undefined8 *)(lVar1 + 0x360) = MULTILABEL::multilabel._48_8_;
    *(undefined8 *)(lVar1 + 0x368) = uVar8;
    *(undefined8 *)(lVar1 + 0x350) = uVar6;
    *(undefined8 *)(lVar1 + 0x358) = uVar7;
    *(undefined8 *)(lVar1 + 0x340) = uVar4;
    *(undefined8 *)(lVar1 + 0x348) = uVar5;
    *(undefined8 *)(lVar1 + 0x330) = uVar2;
    *(undefined8 *)(lVar1 + 0x338) = uVar3;
    *(undefined4 *)(local_18 + 0x3650) = 4;
    *(undefined8 *)(local_18 + 0x3430) = MULTILABEL::multilabel._32_8_;
    in_stack_fffffffffffffd40 = (vw *)LEARNER::make_base<multi_oaa,example>(this_00);
    local_8 = in_stack_fffffffffffffd40;
  }
  else {
    local_8 = (vw *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd40);
  std::unique_ptr<multi_oaa,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<multi_oaa,_void_(*)(void_*)> *)in_stack_fffffffffffffd50);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* multilabel_oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<multi_oaa>();
  option_group_definition new_options("Multilabel One Against All");
  new_options.add(make_option("multilabel_oaa", data->k).keep().help("One-against-all multilabel with <k> labels"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("multilabel_oaa"))
    return nullptr;

  LEARNER::learner<multi_oaa, example>& l = LEARNER::init_learner(data, as_singleline(setup_base(options, all)),
      predict_or_learn<true>, predict_or_learn<false>, data->k, prediction_type::multilabels);
  l.set_finish_example(finish_example);
  all.p->lp = MULTILABEL::multilabel;
  all.label_type = label_type::multi;
  all.delete_prediction = MULTILABEL::multilabel.delete_label;

  return make_base(l);
}